

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eltwise_x86.cpp
# Opt level: O2

int __thiscall
ncnn::Eltwise_x86::forward
          (Eltwise_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float *pfVar1;
  undefined8 uVar2;
  uint uVar3;
  Mat *m;
  Mat *this_00;
  void *pvVar4;
  void *pvVar5;
  void *pvVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  int q;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  float *pfVar20;
  int iVar21;
  long lVar22;
  long lVar23;
  ulong uVar24;
  long lVar25;
  pointer pMVar26;
  long lVar27;
  long lVar28;
  int iVar29;
  float *pfVar30;
  undefined1 (*pauVar31) [16];
  undefined1 (*pauVar32) [16];
  float fVar33;
  float fVar38;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  
  m = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_start;
  uVar3 = m->c;
  uVar17 = (ulong)uVar3;
  iVar21 = m->h * m->w * m->d * m->elempack;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create_like(this_00,m,opt->blob_allocator);
  iVar29 = -100;
  if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
    iVar29 = (this->super_Eltwise).op_type;
    if (iVar29 == 0) {
      pMVar26 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar19 = 0;
      uVar24 = 0;
      if (0 < (int)uVar3) {
        uVar24 = uVar17;
      }
      for (; uVar19 != uVar24; uVar19 = uVar19 + 1) {
        lVar23 = this_00->elemsize * this_00->cstep * uVar19;
        pvVar4 = this_00->data;
        lVar27 = pMVar26[1].elemsize * pMVar26[1].cstep * uVar19;
        pvVar5 = pMVar26[1].data;
        lVar25 = m->elemsize * m->cstep * uVar19;
        pvVar6 = m->data;
        lVar22 = 0;
        lVar28 = 0;
        for (iVar29 = 0; iVar29 + 3 < iVar21; iVar29 = iVar29 + 4) {
          pfVar20 = (float *)((long)pvVar5 + lVar28 + lVar27);
          pfVar30 = (float *)((long)pvVar6 + lVar28 + lVar25);
          auVar37._0_4_ = *pfVar20 * *pfVar30;
          auVar37._4_4_ = pfVar20[1] * pfVar30[1];
          auVar37._8_4_ = pfVar20[2] * pfVar30[2];
          auVar37._12_4_ = pfVar20[3] * pfVar30[3];
          *(undefined1 (*) [16])((long)pvVar4 + lVar28 + lVar23) = auVar37;
          lVar28 = lVar28 + 0x10;
          lVar22 = lVar22 + 4;
        }
        for (; (int)lVar22 < iVar21; lVar22 = lVar22 + 1) {
          *(float *)((long)pvVar4 + lVar22 * 4 + lVar23) =
               *(float *)((long)pvVar5 + lVar22 * 4 + lVar27) *
               *(float *)((long)pvVar6 + lVar22 * 4 + lVar25);
        }
      }
      for (uVar19 = 2;
          pMVar26 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_start,
          uVar19 < (ulong)(((long)(bottom_blobs->
                                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                                  .super__Vector_impl_data._M_finish - (long)pMVar26) / 0x48);
          uVar19 = uVar19 + 1) {
        pMVar26 = pMVar26 + uVar19;
        for (uVar18 = 0; uVar18 != uVar24; uVar18 = uVar18 + 1) {
          pvVar4 = pMVar26->data;
          sVar7 = pMVar26->elemsize;
          sVar8 = pMVar26->cstep;
          pfVar20 = (float *)(sVar8 * uVar18 * sVar7 + (long)pvVar4);
          pvVar5 = this_00->data;
          sVar9 = this_00->elemsize;
          sVar10 = this_00->cstep;
          pauVar31 = (undefined1 (*) [16])(sVar10 * uVar18 * sVar9 + (long)pvVar5);
          lVar22 = 0;
          for (iVar29 = 0; iVar29 + 3 < iVar21; iVar29 = iVar29 + 4) {
            auVar34._0_4_ = *pfVar20 * *(float *)*pauVar31;
            auVar34._4_4_ = pfVar20[1] * *(float *)((long)*pauVar31 + 4);
            auVar34._8_4_ = pfVar20[2] * *(float *)((long)*pauVar31 + 8);
            auVar34._12_4_ = pfVar20[3] * *(float *)((long)*pauVar31 + 0xc);
            *pauVar31 = auVar34;
            pfVar20 = pfVar20 + 4;
            pauVar31 = pauVar31 + 1;
            lVar22 = lVar22 + 4;
          }
          lVar23 = sVar10 * sVar9 * uVar18;
          for (; (int)lVar22 < iVar21; lVar22 = lVar22 + 1) {
            *(float *)((long)pvVar5 + lVar22 * 4 + lVar23) =
                 *(float *)((long)pvVar5 + lVar22 * 4 + lVar23) *
                 *(float *)((long)pvVar4 + lVar22 * 4 + sVar8 * sVar7 * uVar18);
          }
        }
      }
      iVar29 = (this->super_Eltwise).op_type;
    }
    if (iVar29 == 1) {
      uVar24 = 0;
      if (0 < (int)uVar3) {
        uVar24 = uVar17;
      }
      pMVar26 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if ((this->super_Eltwise).coeffs.w == 0) {
        for (uVar19 = 0; uVar19 != uVar24; uVar19 = uVar19 + 1) {
          lVar25 = this_00->elemsize * this_00->cstep * uVar19;
          pvVar4 = this_00->data;
          lVar28 = pMVar26[1].elemsize * pMVar26[1].cstep * uVar19;
          pvVar5 = pMVar26[1].data;
          lVar27 = m->elemsize * m->cstep * uVar19;
          pvVar6 = m->data;
          lVar23 = 0;
          lVar22 = 0;
          for (iVar29 = 0; iVar29 + 3 < iVar21; iVar29 = iVar29 + 4) {
            pfVar20 = (float *)((long)pvVar5 + lVar22 + lVar28);
            pfVar30 = (float *)((long)pvVar6 + lVar22 + lVar27);
            auVar35._0_4_ = *pfVar20 + *pfVar30;
            auVar35._4_4_ = pfVar20[1] + pfVar30[1];
            auVar35._8_4_ = pfVar20[2] + pfVar30[2];
            auVar35._12_4_ = pfVar20[3] + pfVar30[3];
            *(undefined1 (*) [16])((long)pvVar4 + lVar22 + lVar25) = auVar35;
            lVar22 = lVar22 + 0x10;
            lVar23 = lVar23 + 4;
          }
          for (; (int)lVar23 < iVar21; lVar23 = lVar23 + 1) {
            *(float *)((long)pvVar4 + lVar23 * 4 + lVar25) =
                 *(float *)((long)pvVar5 + lVar23 * 4 + lVar28) +
                 *(float *)((long)pvVar6 + lVar23 * 4 + lVar27);
          }
        }
        for (uVar19 = 2;
            pMVar26 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_start,
            uVar19 < (ulong)(((long)(bottom_blobs->
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                    _M_impl.super__Vector_impl_data._M_finish - (long)pMVar26) /
                            0x48); uVar19 = uVar19 + 1) {
          pMVar26 = pMVar26 + uVar19;
          for (uVar18 = 0; uVar18 != uVar24; uVar18 = uVar18 + 1) {
            pvVar4 = pMVar26->data;
            sVar7 = pMVar26->elemsize;
            sVar8 = pMVar26->cstep;
            pfVar20 = (float *)(sVar8 * uVar18 * sVar7 + (long)pvVar4);
            pvVar5 = this_00->data;
            sVar9 = this_00->elemsize;
            sVar10 = this_00->cstep;
            pauVar31 = (undefined1 (*) [16])(sVar10 * uVar18 * sVar9 + (long)pvVar5);
            lVar22 = 0;
            for (iVar29 = 0; iVar29 + 3 < iVar21; iVar29 = iVar29 + 4) {
              auVar36._0_4_ = *pfVar20 + *(float *)*pauVar31;
              auVar36._4_4_ = pfVar20[1] + *(float *)((long)*pauVar31 + 4);
              auVar36._8_4_ = pfVar20[2] + *(float *)((long)*pauVar31 + 8);
              auVar36._12_4_ = pfVar20[3] + *(float *)((long)*pauVar31 + 0xc);
              *pauVar31 = auVar36;
              pfVar20 = pfVar20 + 4;
              pauVar31 = pauVar31 + 1;
              lVar22 = lVar22 + 4;
            }
            lVar23 = sVar10 * sVar9 * uVar18;
            for (; (int)lVar22 < iVar21; lVar22 = lVar22 + 1) {
              *(float *)((long)pvVar5 + lVar22 * 4 + lVar23) =
                   *(float *)((long)pvVar5 + lVar22 * 4 + lVar23) +
                   *(float *)((long)pvVar4 + lVar22 * 4 + sVar8 * sVar7 * uVar18);
            }
          }
        }
      }
      else {
        for (uVar19 = 0; uVar19 != uVar24; uVar19 = uVar19 + 1) {
          uVar2 = *(this->super_Eltwise).coeffs.data;
          fVar33 = (float)uVar2;
          fVar38 = (float)((ulong)uVar2 >> 0x20);
          lVar23 = m->elemsize * m->cstep * uVar19;
          pvVar4 = m->data;
          lVar25 = pMVar26[1].elemsize * pMVar26[1].cstep * uVar19;
          pvVar5 = pMVar26[1].data;
          lVar27 = this_00->elemsize * this_00->cstep * uVar19;
          pvVar6 = this_00->data;
          lVar22 = 0;
          lVar28 = 0;
          for (iVar29 = 0; iVar29 + 3 < iVar21; iVar29 = iVar29 + 4) {
            pfVar20 = (float *)((long)pvVar4 + lVar28 + lVar23);
            fVar11 = pfVar20[1];
            fVar12 = pfVar20[2];
            fVar13 = pfVar20[3];
            pfVar30 = (float *)((long)pvVar5 + lVar28 + lVar25);
            fVar14 = pfVar30[1];
            fVar15 = pfVar30[2];
            fVar16 = pfVar30[3];
            pfVar1 = (float *)((long)pvVar6 + lVar28 + lVar27);
            *pfVar1 = *pfVar30 * fVar38 + *pfVar20 * fVar33;
            pfVar1[1] = fVar14 * fVar38 + fVar11 * fVar33;
            pfVar1[2] = fVar15 * fVar38 + fVar12 * fVar33;
            pfVar1[3] = fVar16 * fVar38 + fVar13 * fVar33;
            lVar28 = lVar28 + 0x10;
            lVar22 = lVar22 + 4;
          }
          for (; (int)lVar22 < iVar21; lVar22 = lVar22 + 1) {
            *(float *)((long)pvVar6 + lVar22 * 4 + lVar27) =
                 *(float *)((long)pvVar5 + lVar22 * 4 + lVar25) * fVar38 +
                 *(float *)((long)pvVar4 + lVar22 * 4 + lVar23) * fVar33;
          }
        }
        for (uVar19 = 2;
            pMVar26 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_start,
            uVar19 < (ulong)(((long)(bottom_blobs->
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                    _M_impl.super__Vector_impl_data._M_finish - (long)pMVar26) /
                            0x48); uVar19 = uVar19 + 1) {
          pMVar26 = pMVar26 + uVar19;
          for (uVar18 = 0; uVar18 != uVar24; uVar18 = uVar18 + 1) {
            pvVar4 = pMVar26->data;
            sVar7 = pMVar26->elemsize;
            sVar8 = pMVar26->cstep;
            pfVar30 = (float *)(sVar8 * uVar18 * sVar7 + (long)pvVar4);
            pvVar5 = this_00->data;
            sVar9 = this_00->elemsize;
            sVar10 = this_00->cstep;
            pfVar20 = (float *)(sVar10 * uVar18 * sVar9 + (long)pvVar5);
            fVar33 = *(float *)((long)(this->super_Eltwise).coeffs.data + uVar19 * 4);
            lVar22 = 0;
            for (iVar29 = 0; iVar29 + 3 < iVar21; iVar29 = iVar29 + 4) {
              fVar38 = pfVar30[1];
              fVar11 = pfVar30[2];
              fVar12 = pfVar30[3];
              *pfVar20 = *pfVar30 * fVar33 + *pfVar20;
              pfVar20[1] = fVar38 * fVar33 + pfVar20[1];
              pfVar20[2] = fVar11 * fVar33 + pfVar20[2];
              pfVar20[3] = fVar12 * fVar33 + pfVar20[3];
              pfVar30 = pfVar30 + 4;
              pfVar20 = pfVar20 + 4;
              lVar22 = lVar22 + 4;
            }
            lVar23 = sVar10 * sVar9 * uVar18;
            for (; (int)lVar22 < iVar21; lVar22 = lVar22 + 1) {
              *(float *)((long)pvVar5 + lVar22 * 4 + lVar23) =
                   *(float *)((long)pvVar4 + lVar22 * 4 + sVar8 * sVar7 * uVar18) * fVar33 +
                   *(float *)((long)pvVar5 + lVar22 * 4 + lVar23);
            }
          }
        }
      }
    }
    iVar29 = 0;
    if ((this->super_Eltwise).op_type == 2) {
      uVar24 = 2;
      pMVar26 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar19 = 0;
      if ((int)uVar3 < 1) {
        uVar17 = uVar19;
      }
      for (; uVar19 != uVar17; uVar19 = uVar19 + 1) {
        lVar22 = m->elemsize * m->cstep * uVar19;
        pvVar4 = m->data;
        lVar25 = pMVar26[1].elemsize * pMVar26[1].cstep * uVar19;
        pvVar5 = pMVar26[1].data;
        lVar27 = this_00->elemsize * this_00->cstep * uVar19;
        pvVar6 = this_00->data;
        lVar23 = 0;
        lVar28 = 0;
        for (iVar29 = 0; iVar29 + 3 < iVar21; iVar29 = iVar29 + 4) {
          auVar37 = maxps(*(undefined1 (*) [16])((long)pvVar4 + lVar28 + lVar22),
                          *(undefined1 (*) [16])((long)pvVar5 + lVar28 + lVar25));
          *(undefined1 (*) [16])((long)pvVar6 + lVar28 + lVar27) = auVar37;
          lVar28 = lVar28 + 0x10;
          lVar23 = lVar23 + 4;
        }
        for (; (int)lVar23 < iVar21; lVar23 = lVar23 + 1) {
          fVar38 = *(float *)((long)pvVar5 + lVar23 * 4 + lVar25);
          fVar33 = *(float *)((long)pvVar4 + lVar23 * 4 + lVar22);
          if (fVar38 <= fVar33) {
            fVar38 = fVar33;
          }
          *(float *)((long)pvVar6 + lVar23 * 4 + lVar27) = fVar38;
        }
      }
      for (; pMVar26 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_start,
          uVar24 < (ulong)(((long)(bottom_blobs->
                                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                                  .super__Vector_impl_data._M_finish - (long)pMVar26) / 0x48);
          uVar24 = uVar24 + 1) {
        pMVar26 = pMVar26 + uVar24;
        for (uVar19 = 0; uVar19 != uVar17; uVar19 = uVar19 + 1) {
          pvVar4 = pMVar26->data;
          sVar7 = pMVar26->elemsize;
          sVar8 = pMVar26->cstep;
          pauVar31 = (undefined1 (*) [16])(sVar8 * uVar19 * sVar7 + (long)pvVar4);
          pvVar5 = this_00->data;
          sVar9 = this_00->elemsize;
          sVar10 = this_00->cstep;
          pauVar32 = (undefined1 (*) [16])(sVar10 * uVar19 * sVar9 + (long)pvVar5);
          lVar22 = 0;
          for (iVar29 = 0; iVar29 + 3 < iVar21; iVar29 = iVar29 + 4) {
            auVar37 = maxps(*pauVar32,*pauVar31);
            *pauVar32 = auVar37;
            pauVar31 = pauVar31 + 1;
            pauVar32 = pauVar32 + 1;
            lVar22 = lVar22 + 4;
          }
          lVar23 = sVar10 * sVar9 * uVar19;
          for (; (int)lVar22 < iVar21; lVar22 = lVar22 + 1) {
            fVar38 = *(float *)((long)pvVar5 + lVar22 * 4 + lVar23);
            fVar33 = *(float *)((long)pvVar4 + lVar22 * 4 + sVar8 * sVar7 * uVar19);
            if (fVar38 <= fVar33) {
              fVar38 = fVar33;
            }
            *(float *)((long)pvVar5 + lVar22 * 4 + lVar23) = fVar38;
          }
        }
      }
      iVar29 = 0;
    }
  }
  return iVar29;
}

Assistant:

int Eltwise_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int elempack = bottom_blob.elempack;
    int size = w * h * d * elempack;

    Mat& top_blob = top_blobs[0];
    top_blob.create_like(bottom_blob, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (op_type == Operation_PROD)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m512 _p1 = _mm512_loadu_ps(ptr1);
                _p = _mm512_mul_ps(_p, _p1);
                _mm512_storeu_ps(outptr, _p);

                ptr += 16;
                ptr1 += 16;
                outptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _p1 = _mm256_loadu_ps(ptr1);
                _p = _mm256_mul_ps(_p, _p1);
                _mm256_storeu_ps(outptr, _p);

                ptr += 8;
                ptr1 += 8;
                outptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_load_ps(ptr);
                __m128 _p1 = _mm_load_ps(ptr1);
                _p = _mm_mul_ps(_p, _p1);
                _mm_store_ps(outptr, _p);

                ptr += 4;
                ptr1 += 4;
                outptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                *outptr = *ptr * *ptr1;

                ptr++;
                ptr1++;
                outptr++;
            }
        }

        for (size_t b = 2; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob2 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob2.channel(q);
                float* outptr = top_blob.channel(q);

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(outptr);
                    __m512 _p1 = _mm512_loadu_ps(ptr);
                    _p = _mm512_mul_ps(_p, _p1);
                    _mm512_storeu_ps(outptr, _p);

                    ptr += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(outptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr);
                    _p = _mm256_mul_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    outptr += 8;
                }
#endif // __AVX__
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_load_ps(outptr);
                    __m128 _p1 = _mm_load_ps(ptr);
                    _p = _mm_mul_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr *= *ptr;

                    ptr++;
                    outptr++;
                }
            }
        }
    }
    if (op_type == Operation_SUM)
    {
        if (coeffs.w == 0)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    __m512 _p1 = _mm512_loadu_ps(ptr1);
                    _p = _mm512_add_ps(_p, _p1);
                    _mm512_storeu_ps(outptr, _p);

                    ptr += 16;
                    ptr1 += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr1);
                    _p = _mm256_add_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    ptr1 += 8;
                    outptr += 8;
                }
#endif // __AVX__
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    __m128 _p1 = _mm_load_ps(ptr1);
                    _p = _mm_add_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    ptr1 += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr = *ptr + *ptr1;

                    ptr++;
                    ptr1++;
                    outptr++;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                    for (; i + 15 < size; i += 16)
                    {
                        __m512 _p = _mm512_loadu_ps(outptr);
                        __m512 _p1 = _mm512_loadu_ps(ptr);
                        _p = _mm512_add_ps(_p, _p1);
                        _mm512_storeu_ps(outptr, _p);

                        ptr += 16;
                        outptr += 16;
                    }
#endif // __AVX512F__
                    for (; i + 7 < size; i += 8)
                    {
                        __m256 _p = _mm256_loadu_ps(outptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr);
                        _p = _mm256_add_ps(_p, _p1);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        outptr += 8;
                    }
#endif // __AVX__
                    for (; i + 3 < size; i += 4)
                    {
                        __m128 _p = _mm_load_ps(outptr);
                        __m128 _p1 = _mm_load_ps(ptr);
                        _p = _mm_add_ps(_p, _p1);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        outptr += 4;
                    }
#endif // __SSE2__
                    for (; i < size; i++)
                    {
                        *outptr += *ptr;

                        ptr++;
                        outptr++;
                    }
                }
            }
        }
        else
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                const float coeff0 = coeffs[0];
                const float coeff1 = coeffs[1];

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _coeff0_avx512 = _mm512_set1_ps(coeff0);
                __m512 _coeff1_avx512 = _mm512_set1_ps(coeff1);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    __m512 _p1 = _mm512_loadu_ps(ptr1);
                    _p = _mm512_mul_ps(_p, _coeff0_avx512);
                    _p = _mm512_fmadd_ps(_p1, _coeff1_avx512, _p);
                    _mm512_storeu_ps(outptr, _p);

                    ptr += 16;
                    ptr1 += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                __m256 _coeff0_avx = _mm256_set1_ps(coeff0);
                __m256 _coeff1_avx = _mm256_set1_ps(coeff1);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr1);
                    _p = _mm256_mul_ps(_p, _coeff0_avx);
                    _p = _mm256_comp_fmadd_ps(_p1, _coeff1_avx, _p);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    ptr1 += 8;
                    outptr += 8;
                }
#endif // __AVX__
                __m128 _coeff0 = _mm_set1_ps(coeff0);
                __m128 _coeff1 = _mm_set1_ps(coeff1);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    __m128 _p1 = _mm_load_ps(ptr1);
                    _p = _mm_mul_ps(_p, _coeff0);
                    _p1 = _mm_mul_ps(_p1, _coeff1);
                    _p = _mm_add_ps(_p1, _p);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    ptr1 += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr = *ptr * coeff0 + *ptr1 * coeff1;

                    ptr++;
                    ptr1++;
                    outptr++;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    const float coeff = coeffs[b];

                    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                    __m512 _coeff_avx512 = _mm512_set1_ps(coeff);
                    for (; i + 15 < size; i += 16)
                    {
                        __m512 _p = _mm512_loadu_ps(outptr);
                        __m512 _p1 = _mm512_loadu_ps(ptr);
                        _p = _mm512_fmadd_ps(_p1, _coeff_avx512, _p);
                        _mm512_storeu_ps(outptr, _p);

                        ptr += 16;
                        outptr += 16;
                    }
#endif // __AVX512F__
                    __m256 _coeff_avx = _mm256_set1_ps(coeff);
                    for (; i + 7 < size; i += 8)
                    {
                        __m256 _p = _mm256_loadu_ps(outptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr);
                        _p = _mm256_comp_fmadd_ps(_p1, _coeff_avx, _p);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        outptr += 8;
                    }
#endif // __AVX__
                    __m128 _coeff = _mm_set1_ps(coeff);
                    for (; i + 3 < size; i += 4)
                    {
                        __m128 _p1 = _mm_load_ps(ptr);
                        __m128 _p = _mm_load_ps(outptr);
                        _p1 = _mm_mul_ps(_p1, _coeff);
                        _p = _mm_add_ps(_p1, _p);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        outptr += 4;
                    }
#endif // __SSE2__
                    for (; i < size; i++)
                    {
                        *outptr += *ptr * coeff;

                        ptr++;
                        outptr++;
                    }
                }
            }
        }
    }
    if (op_type == Operation_MAX)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m512 _p1 = _mm512_loadu_ps(ptr1);
                _p = _mm512_max_ps(_p, _p1);
                _mm512_storeu_ps(outptr, _p);

                ptr += 16;
                ptr1 += 16;
                outptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _p1 = _mm256_loadu_ps(ptr1);
                _p = _mm256_max_ps(_p, _p1);
                _mm256_storeu_ps(outptr, _p);

                ptr += 8;
                ptr1 += 8;
                outptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_load_ps(ptr);
                __m128 _p1 = _mm_load_ps(ptr1);
                _p = _mm_max_ps(_p, _p1);
                _mm_store_ps(outptr, _p);

                ptr += 4;
                ptr1 += 4;
                outptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                *outptr = std::max(*ptr, *ptr1);

                ptr++;
                ptr1++;
                outptr++;
            }
        }

        for (size_t b = 2; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob2 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob2.channel(q);
                float* outptr = top_blob.channel(q);

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(outptr);
                    __m512 _p1 = _mm512_loadu_ps(ptr);
                    _p = _mm512_max_ps(_p, _p1);
                    _mm512_storeu_ps(outptr, _p);

                    ptr += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(outptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr);
                    _p = _mm256_max_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    outptr += 8;
                }
#endif // __AVX__
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_load_ps(outptr);
                    __m128 _p1 = _mm_load_ps(ptr);
                    _p = _mm_max_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr = std::max(*ptr, *outptr);

                    ptr++;
                    outptr++;
                }
            }
        }
    }

    return 0;
}